

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsxmem(prscxdef *ctx)

{
  int iVar1;
  int iVar2;
  prscxdef *ppVar3;
  prsndef *in_RDI;
  prpnum prop;
  tokdef newtok;
  tokdef *tok;
  prsndef *n2;
  prsndef *n1;
  prsndef *in_stack_ffffffffffffff38;
  prscxdef *in_stack_ffffffffffffff40;
  prsndef *in_stack_ffffffffffffff48;
  prscxdef *in_stack_ffffffffffffff50;
  prscxdef *in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff64;
  prpnum in_stack_ffffffffffffff66;
  prscxdef *in_stack_ffffffffffffffc8;
  prscxdef *local_20;
  prscxdef *local_18;
  tokcxdef *in_stack_fffffffffffffff8;
  
  local_18 = (prscxdef *)prsxatm(in_stack_ffffffffffffffc8);
  while( true ) {
    while( true ) {
      while (iVar2 = *(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28), iVar2 == 0x32) {
        iVar2 = toknext(in_stack_fffffffffffffff8);
        if (iVar2 == 0x33) {
          toknext(in_stack_fffffffffffffff8);
          local_18 = (prscxdef *)
                     prsnew1(in_stack_ffffffffffffff50,
                             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                             (prsndef *)in_stack_ffffffffffffff40);
        }
        else {
          in_stack_ffffffffffffff38 = in_RDI;
          prsxarg(in_stack_ffffffffffffff58);
          ppVar3 = (prscxdef *)
                   prsnew2(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                           ,(prsndef *)local_18,in_stack_ffffffffffffff38);
          in_stack_ffffffffffffff40 = local_18;
          local_18 = ppVar3;
        }
      }
      if (iVar2 == 0x3a) break;
      if (iVar2 != 0x40) {
        if ((iVar2 == 0x96) || (iVar2 == 0x98)) {
          local_18 = (prscxdef *)
                     prsnew1(in_stack_ffffffffffffff50,
                             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                             (prsndef *)in_stack_ffffffffffffff40);
          toknext(in_stack_fffffffffffffff8);
        }
        return (prsndef *)local_18;
      }
      iVar1 = toknext(in_stack_fffffffffffffff8);
      if (iVar1 == 0x32) {
        toknext(in_stack_fffffffffffffff8);
        local_20 = (prscxdef *)
                   prsxexp(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                          );
        prsreq(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      }
      else if ((*(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28) == 0x38) &&
              ((in_RDI->prsnv).prsnvn[0][2].prsnv.prsnvt.toksym.toksnam[0x21] == '\x04')) {
        local_20 = (prscxdef *)
                   prsnew0(in_stack_ffffffffffffff40,(tokdef *)in_stack_ffffffffffffff38);
        toknext(in_stack_fffffffffffffff8);
      }
      else {
        in_stack_ffffffffffffff66 = prsrqpr(in_stack_ffffffffffffff40);
        local_20 = (prscxdef *)
                   prsnew0(in_stack_ffffffffffffff40,(tokdef *)in_stack_ffffffffffffff38);
      }
      if (*(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28) == 0x32) {
        toknext(in_stack_fffffffffffffff8);
        in_stack_ffffffffffffff48 = in_RDI;
        prsxarg(local_20);
        ppVar3 = (prscxdef *)
                 prsnew3((prscxdef *)
                         CONCAT26(in_stack_ffffffffffffff66,
                                  CONCAT24(in_stack_ffffffffffffff64,iVar2)),
                         (int)((ulong)local_20 >> 0x20),(prsndef *)local_18,
                         in_stack_ffffffffffffff48,(prsndef *)in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff50 = local_18;
        in_stack_ffffffffffffff58 = local_20;
        local_18 = ppVar3;
      }
      else {
        local_18 = (prscxdef *)
                   prsnew2(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20)
                           ,(prsndef *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
    if ((undefined1  [112])((undefined1  [112])in_RDI[1].prsnv & (undefined1  [112])0x4) !=
        (undefined1  [112])0x0) break;
    toknext(in_stack_fffffffffffffff8);
    prsxexp(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    local_18 = (prscxdef *)
               prsnew2(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                       (prsndef *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    prsreq(in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  }
  return (prsndef *)local_18;
}

Assistant:

static prsndef *prsxmem(prscxdef *ctx)
{
    prsndef *n1, *n2;
    tokdef  *tok;
    tokdef   newtok;
    prpnum   prop;
    
    n1 = prsxatm(ctx);
    for ( ;; )
    {
        tok = &ctx->prscxtok->tokcxcur;
        switch(tok->toktyp)
        {
        case TOKTDOT:
            if (toknext(ctx->prscxtok) == TOKTLPAR)
            {
                toknext(ctx->prscxtok);
                n2 = prsxexp(ctx, FALSE);
                prsreq(ctx, TOKTRPAR);
            }
            else if (ctx->prscxtok->tokcxcur.toktyp == TOKTSYMBOL &&
                     ctx->prscxtok->tokcxcur.toksym.tokstyp == TOKSTLOCAL)
            {
                n2 = prsnew0(ctx, &ctx->prscxtok->tokcxcur);
                toknext(ctx->prscxtok);
            }
            else
            {
                prop = prsrqpr(ctx);
                newtok.toktyp = TOKTPOUND;
                newtok.tokofs = prop;
                n2 = prsnew0(ctx, &newtok);
            }

            /* see if there's an argument list for the method */
            if (ctx->prscxtok->tokcxcur.toktyp == TOKTLPAR)
            {
                toknext(ctx->prscxtok);
                n1 = prsnew3(ctx, TOKTDOT, n1, n2, prsxarg(ctx));
            }
            else
                n1 = prsnew2(ctx, TOKTDOT, n1, n2);

            break;
            
        case TOKTLBRACK:
            if (ctx->prscxflg & PRSCXFLST) return(n1);
            toknext(ctx->prscxtok);
            n2 = prsxexp(ctx, FALSE);
            n1 = prsnew2(ctx, TOKTLBRACK, n1, n2);
            prsreq(ctx, TOKTRBRACK);
            break;
            
        case TOKTLPAR:
            if (toknext(ctx->prscxtok) == TOKTRPAR)
            {
                toknext(ctx->prscxtok);
                n1 = prsnew1(ctx, TOKTLPAR, n1);
            }
            else
                n1 = prsnew2(ctx, TOKTLPAR, n1, prsxarg(ctx));
            break;
            
        case TOKTINC:
        case TOKTDEC:
            n1 = prsnew1(ctx, tok->toktyp + 1, n1);
            toknext(ctx->prscxtok);
            return(n1);
            
        default:
            return(n1);
        }
    }
}